

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O3

void dump_fasta(char *mapped_characters,long firstSequenceLength,FILE *output,bool newln,
               bool is_prot,unsigned_long from,unsigned_long to)

{
  char *pcVar1;
  long c;
  long lVar2;
  
  if (to == 0 && from == 0) {
    if (0 < firstSequenceLength) {
      lVar2 = 0;
      do {
        pcVar1 = "ACGTURYSWKMBDHVN?-";
        if (is_prot) {
          pcVar1 = "ACDEFGHIKLMNPQRSTVWYBZX?-";
        }
        fputc((int)pcVar1[(byte)mapped_characters[lVar2]],(FILE *)output);
        lVar2 = lVar2 + 1;
      } while (firstSequenceLength != lVar2);
    }
  }
  else if (from <= to) {
    do {
      pcVar1 = "ACGTURYSWKMBDHVN?-";
      if (is_prot) {
        pcVar1 = "ACDEFGHIKLMNPQRSTVWYBZX?-";
      }
      fputc((int)pcVar1[(byte)mapped_characters[from]],(FILE *)output);
      from = from + 1;
    } while (from <= to);
  }
  if (!newln) {
    return;
  }
  fputc(10,(FILE *)output);
  return;
}

Assistant:

void dump_fasta (const char* mapped_characters, const long firstSequenceLength, FILE *output, bool newln, bool is_prot, unsigned long from, unsigned long to) {
  if (from > 0 || to > 0) {
    for (long c = from; c <= to; c++) {
      fputc( is_prot ? ValidCharsAA[(unsigned char)mapped_characters[c]] : ValidChars[(unsigned char)mapped_characters[c]], output);
    }
  } else {
    for (long c = 0; c < firstSequenceLength; c++) {
      fputc( is_prot ? ValidCharsAA[(unsigned char)mapped_characters[c]] : ValidChars[(unsigned char)mapped_characters[c]], output);
    }
  }
  if (newln) {
    fprintf (output, "\n"); 
  }
}